

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void hexdump(char *data,char *mask,size_t len)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  
  uVar8 = 0;
  pcVar9 = data;
  do {
    printf("#%07x: ",uVar8 & 0xffffffff);
    lVar4 = 0;
    iVar2 = 0;
    do {
      uVar7 = 0;
      bVar1 = true;
      do {
        iVar5 = iVar2;
        bVar6 = bVar1;
        uVar7 = uVar7 | uVar8 + lVar4 * 2;
        if ((long)(int)len <= (long)uVar7) goto LAB_00101670;
        if (mask == (char *)0x0) {
          printf("%02x",(ulong)(byte)data[uVar7]);
        }
        else {
          if (mask[uVar7] != '\0') {
            printf("%s","\x1b[30;1m");
          }
          printf("%02x",(ulong)(byte)data[uVar7]);
          if (mask[uVar7] != '\0') {
            printf("%s","\x1b[0m");
          }
        }
        uVar7 = 1;
        bVar1 = false;
        iVar2 = iVar5 + 2;
      } while (bVar6);
      putchar(0x20);
      iVar2 = iVar5 + 3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    iVar5 = iVar5 + 3;
LAB_00101670:
    if (iVar5 < 0x29) {
      iVar5 = iVar5 + -0x29;
      do {
        putchar(0x20);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
    }
    ppuVar3 = __ctype_b_loc();
    lVar4 = 0;
    do {
      iVar2 = 0x2e;
      if (((*ppuVar3)[(int)pcVar9[lVar4]] >> 0xe & 1) != 0) {
        iVar2 = (int)pcVar9[lVar4];
      }
      putchar(iVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    putchar(10);
    uVar8 = uVar8 + 0x10;
    pcVar9 = pcVar9 + 0x10;
    if ((int)len <= (int)uVar8) {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}